

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool cmDependsFortran::CopyModule
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  pointer pbVar1;
  bool bVar2;
  Status SVar3;
  ostream *poVar4;
  string *stampFile;
  string *psVar5;
  bool bVar6;
  string_view str;
  string_view str_00;
  string_view str_01;
  string mod;
  string mod_upper;
  string mod_lower;
  string mod_dir;
  string compilerId;
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&mod,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  compilerId._M_dataplus._M_p = (pointer)&compilerId.field_2;
  compilerId._M_string_length = 0;
  compilerId.field_2._M_local_buf[0] = '\0';
  if (0x80 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
    std::__cxx11::string::_M_assign((string *)&compilerId);
  }
  str._M_str = mod._M_dataplus._M_p;
  str._M_len = mod._M_string_length;
  bVar2 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])".mod");
  if (!bVar2) {
    str_00._M_str = mod._M_dataplus._M_p;
    str_00._M_len = mod._M_string_length;
    bVar2 = cmHasLiteralSuffix<6ul>(str_00,(char (*) [6])".smod");
    if (!bVar2) {
      str_01._M_str = mod._M_dataplus._M_p;
      str_01._M_len = mod._M_string_length;
      bVar2 = cmHasLiteralSuffix<5ul>(str_01,(char (*) [5])".sub");
      if (!bVar2) {
        std::__cxx11::string::append((char *)&mod);
      }
    }
  }
  cmsys::SystemTools::GetFilenamePath(&mod_dir,&mod);
  if (mod_dir._M_string_length != 0) {
    std::__cxx11::string::append((char *)&mod_dir);
  }
  std::__cxx11::string::string((string *)&mod_upper,(string *)&mod_dir);
  std::__cxx11::string::string((string *)&mod_lower,(string *)&mod_dir);
  cmsys::SystemTools::GetFilenameName(&local_40,&mod);
  cmFortranModuleAppendUpperLower(&local_40,&mod_upper,&mod_lower);
  std::__cxx11::string::~string((string *)&local_40);
  bVar2 = cmsys::SystemTools::FileExists(&mod_upper,true);
  stampFile = pbVar1 + 3;
  if (bVar2) {
    bVar2 = ModulesDiffer(&mod_upper,stampFile,&compilerId);
    bVar6 = true;
    if (!bVar2) goto LAB_003d2b29;
    psVar5 = &mod_upper;
    SVar3 = cmsys::SystemTools::CopyFileAlways(psVar5,stampFile);
    if (SVar3.Kind_ == Success) goto LAB_003d2b29;
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module from \"");
LAB_003d2aa1:
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,"\" to \"");
    psVar5 = stampFile;
  }
  else {
    psVar5 = &mod_lower;
    bVar2 = cmsys::SystemTools::FileExists(psVar5,true);
    if (bVar2) {
      bVar2 = ModulesDiffer(&mod_lower,stampFile,&compilerId);
      bVar6 = true;
      if (!bVar2) goto LAB_003d2b29;
      psVar5 = &mod_lower;
      SVar3 = cmsys::SystemTools::CopyFileAlways(psVar5,stampFile);
      if (SVar3.Kind_ == Success) goto LAB_003d2b29;
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module from \"");
      goto LAB_003d2aa1;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module \"");
    poVar4 = std::operator<<(poVar4,(string *)
                                    ((args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 2));
    poVar4 = std::operator<<(poVar4,"\".  Tried \"");
    poVar4 = std::operator<<(poVar4,(string *)&mod_upper);
    poVar4 = std::operator<<(poVar4,"\" and \"");
  }
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  std::operator<<(poVar4,"\".\n");
  bVar6 = false;
LAB_003d2b29:
  std::__cxx11::string::~string((string *)&mod_lower);
  std::__cxx11::string::~string((string *)&mod_upper);
  std::__cxx11::string::~string((string *)&mod_dir);
  std::__cxx11::string::~string((string *)&compilerId);
  std::__cxx11::string::~string((string *)&mod);
  return bVar6;
}

Assistant:

bool cmDependsFortran::CopyModule(const std::vector<std::string>& args)
{
  // Implements
  //
  //   $(CMAKE_COMMAND) -E cmake_copy_f90_mod input.mod output.mod.stamp
  //                                          [compiler-id]
  //
  // Note that the case of the .mod file depends on the compiler.  In
  // the future this copy could also account for the fact that some
  // compilers include a timestamp in the .mod file so it changes even
  // when the interface described in the module does not.

  std::string mod = args[2];
  std::string const& stamp = args[3];
  std::string compilerId;
  if (args.size() >= 5) {
    compilerId = args[4];
  }
  if (!cmHasLiteralSuffix(mod, ".mod") && !cmHasLiteralSuffix(mod, ".smod") &&
      !cmHasLiteralSuffix(mod, ".sub")) {
    // Support depend.make files left by older versions of CMake.
    // They do not include the ".mod" extension.
    mod += ".mod";
  }
  std::string mod_dir = cmSystemTools::GetFilenamePath(mod);
  if (!mod_dir.empty()) {
    mod_dir += "/";
  }
  std::string mod_upper = mod_dir;
  std::string mod_lower = mod_dir;
  cmFortranModuleAppendUpperLower(cmSystemTools::GetFilenameName(mod),
                                  mod_upper, mod_lower);
  if (cmSystemTools::FileExists(mod_upper, true)) {
    if (cmDependsFortran::ModulesDiffer(mod_upper, stamp, compilerId)) {
      if (!cmSystemTools::CopyFileAlways(mod_upper, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_upper
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }
  if (cmSystemTools::FileExists(mod_lower, true)) {
    if (cmDependsFortran::ModulesDiffer(mod_lower, stamp, compilerId)) {
      if (!cmSystemTools::CopyFileAlways(mod_lower, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_lower
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }

  std::cerr << "Error copying Fortran module \"" << args[2] << "\".  Tried \""
            << mod_upper << "\" and \"" << mod_lower << "\".\n";
  return false;
}